

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::TraverseSchema::validateRedefineNameChange
          (TraverseSchema *this,DOMElement *redefineChildElem,XMLCh *redefineChildComponentName,
          XMLCh *redefineChildTypeName,int redefineNameCounter,SchemaInfo *redefiningSchemaInfo)

{
  XMLBuffer *this_00;
  short *psVar1;
  XMLCh XVar2;
  short sVar3;
  short sVar4;
  XMLStringPool *pXVar5;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *pRVar6;
  RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> *pRVar7;
  RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *pRVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  undefined4 extraout_var;
  XMLCh *pXVar15;
  DatatypeValidator *pDVar16;
  short *psVar17;
  XMLCh *pXVar18;
  undefined4 extraout_var_01;
  ulong uVar19;
  DOMNode *node;
  undefined4 extraout_var_02;
  DOMNode *node_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  XMLCh *pXVar20;
  short *psVar21;
  long lVar22;
  char16_t *valueToAdopt;
  XMLSize_t XVar23;
  undefined2 *puVar24;
  XMLCh XVar25;
  RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *this_01;
  RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *pRVar26;
  RefHashTableBucketElem<xercesc_4_0::XercesGroupInfo> *pRVar27;
  RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *pRVar28;
  undefined4 extraout_var_00;
  
  iVar10 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                     (this->fStringPool,redefineChildTypeName);
  this_00 = &this->fBuffer;
  pXVar18 = this->fTargetNSURIString;
  (this->fBuffer).fIndex = 0;
  if ((pXVar18 != (XMLCh *)0x0) && (*pXVar18 != L'\0')) {
    XMLBuffer::append(this_00,pXVar18);
  }
  if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  XVar23 = (this->fBuffer).fIndex;
  (this->fBuffer).fIndex = XVar23 + 1;
  (this->fBuffer).fBuffer[XVar23] = L',';
  XMLBuffer::append(this_00,redefineChildTypeName);
  pXVar5 = this->fStringPool;
  (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
  iVar11 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])();
  iVar12 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[10])();
  pXVar18 = (XMLCh *)CONCAT44(extraout_var,iVar12);
  this->fSchemaInfo = redefiningSchemaInfo;
  if (redefineChildComponentName == L"simpleType") {
LAB_0033e02d:
    pDVar16 = DatatypeValidatorFactory::getDatatypeValidator(this->fDatatypeRegistry,pXVar18);
    if (pDVar16 != (DatatypeValidator *)0x0) goto LAB_0033e977;
    node_00 = &XUtil::getFirstChildElement(&redefineChildElem->super_DOMNode)->super_DOMNode;
    if (node_00 == (DOMNode *)0x0) {
      node_00 = (DOMNode *)0x0;
    }
    else {
      iVar12 = (*node_00->_vptr_DOMNode[0x18])(node_00);
      psVar17 = (short *)CONCAT44(extraout_var_00,iVar12);
      if (psVar17 == &SchemaSymbols::fgELT_ANNOTATION) {
LAB_0033e1ea:
        node_00 = &XUtil::getNextSiblingElement(node_00)->super_DOMNode;
      }
      else {
        psVar21 = &SchemaSymbols::fgELT_ANNOTATION;
        if (psVar17 == (short *)0x0) {
LAB_0033e1e4:
          if (*psVar21 == 0) goto LAB_0033e1ea;
        }
        else {
          do {
            sVar3 = *psVar17;
            if (sVar3 == 0) goto LAB_0033e1e4;
            psVar17 = psVar17 + 1;
            sVar4 = *psVar21;
            psVar21 = psVar21 + 1;
          } while (sVar3 == sVar4);
        }
      }
    }
    if (node_00 == (DOMNode *)0x0) {
LAB_0033e257:
      node_00 = &redefineChildElem->super_DOMNode;
      iVar10 = 0x78;
    }
    else {
      iVar12 = (*node_00->_vptr_DOMNode[0x18])(node_00);
      psVar17 = (short *)CONCAT44(extraout_var_01,iVar12);
      if (psVar17 != &SchemaSymbols::fgELT_RESTRICTION) {
        psVar21 = &SchemaSymbols::fgELT_RESTRICTION;
        redefineChildElem = (DOMElement *)node_00;
        if (psVar17 == (short *)0x0) {
LAB_0033e244:
          if (*psVar21 == 0) goto LAB_0033e261;
        }
        else {
          do {
            sVar3 = *psVar17;
            if (sVar3 == 0) goto LAB_0033e244;
            psVar17 = psVar17 + 1;
            sVar4 = *psVar21;
            psVar21 = psVar21 + 1;
          } while (sVar3 == sVar4);
        }
        goto LAB_0033e257;
      }
LAB_0033e261:
      pXVar18 = getElementAttValue(this,(DOMElement *)node_00,(XMLCh *)SchemaSymbols::fgATT_BASE,
                                   QName);
      iVar12 = XMLString::indexOf(pXVar18,L':');
      if (iVar12 + 1U < 2) {
        pXVar15 = L"";
      }
      else {
        (this->fBuffer).fIndex = 0;
        XMLBuffer::append(this_00,pXVar18,(long)iVar12);
        pXVar5 = this->fStringPool;
        (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
        uVar13 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
        iVar12 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar13);
        pXVar15 = (XMLCh *)CONCAT44(extraout_var_04,iVar12);
      }
      iVar12 = XMLString::indexOf(pXVar18,L':');
      XVar23 = 0;
      if (pXVar18 != (XMLCh *)0x0) {
        do {
          psVar17 = (short *)((long)pXVar18 + XVar23);
          XVar23 = XVar23 + 2;
        } while (*psVar17 != 0);
        XVar23 = ((long)XVar23 >> 1) - 1;
      }
      if (XVar23 == (long)(iVar12 + 1)) {
        puVar24 = &XMLUni::fgZeroLenString;
      }
      else {
        if (iVar12 == -1) {
          this_00->fIndex = 0;
          pXVar20 = pXVar18;
        }
        else {
          XVar23 = XVar23 + ~(long)iVar12;
          this_00->fIndex = 0;
          pXVar20 = pXVar18 + (long)iVar12 + 1;
        }
        XMLBuffer::append(this_00,pXVar20,XVar23);
        pXVar5 = this->fStringPool;
        (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
        uVar13 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
        iVar12 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar13);
        puVar24 = (undefined2 *)CONCAT44(extraout_var_06,iVar12);
      }
      pXVar15 = resolvePrefixToURI(this,(DOMElement *)node_00,pXVar15);
      iVar12 = this->fTargetNSURI;
      iVar14 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                         (this->fURIStringPool,pXVar15);
      if ((iVar12 == iVar14) &&
         (iVar12 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                             (this->fStringPool,puVar24), iVar12 == iVar10)) {
        puVar24 = &SchemaSymbols::fgELT_SIMPLETYPE;
        goto LAB_0033e913;
      }
      iVar10 = 0x79;
    }
LAB_0033e972:
    reportSchemaError(this,(DOMElement *)node_00,L"http://apache.org/xml/messages/XMLErrors",iVar10)
    ;
LAB_0033e977:
    bVar9 = false;
  }
  else {
    pXVar15 = L"simpleType";
    pXVar20 = redefineChildComponentName;
    if (redefineChildComponentName == (XMLCh *)0x0) {
LAB_0033dfe9:
      if (*pXVar15 == L'\0') goto LAB_0033e02d;
    }
    else {
      do {
        XVar25 = *pXVar20;
        if (XVar25 == L'\0') goto LAB_0033dfe9;
        XVar2 = *pXVar15;
        pXVar15 = pXVar15 + 1;
        pXVar20 = pXVar20 + 1;
      } while (XVar25 == XVar2);
    }
    if (redefineChildComponentName == L"complexType") {
LAB_0033e0e1:
      pRVar6 = this->fComplexTypeRegistry;
      if ((pXVar18 == (XMLCh *)0x0) || (uVar19 = (ulong)(ushort)*pXVar18, uVar19 == 0)) {
        uVar19 = 0;
      }
      else {
        XVar25 = pXVar18[1];
        if (XVar25 != L'\0') {
          pXVar15 = pXVar18 + 2;
          do {
            uVar19 = (ulong)(ushort)XVar25 + (uVar19 >> 0x18) + uVar19 * 0x26;
            XVar25 = *pXVar15;
            pXVar15 = pXVar15 + 1;
          } while (XVar25 != L'\0');
        }
        uVar19 = uVar19 % pRVar6->fHashModulus;
      }
      pRVar26 = pRVar6->fBucketList[uVar19];
      if (pRVar26 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0) {
        do {
          bVar9 = StringHasher::equals((StringHasher *)&pRVar6->field_0x30,pXVar18,pRVar26->fKey);
          if (bVar9) goto LAB_0033e977;
          pRVar26 = pRVar26->fNext;
        } while (pRVar26 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0);
        if (bVar9) goto LAB_0033e977;
      }
      node = &XUtil::getFirstChildElement(&redefineChildElem->super_DOMNode)->super_DOMNode;
      if (node == (DOMNode *)0x0) {
        node = (DOMNode *)0x0;
      }
      else {
        iVar12 = (*node->_vptr_DOMNode[0x18])(node);
        psVar17 = (short *)CONCAT44(extraout_var_02,iVar12);
        if (psVar17 == &SchemaSymbols::fgELT_ANNOTATION) {
LAB_0033e3cb:
          node = &XUtil::getNextSiblingElement(node)->super_DOMNode;
        }
        else {
          psVar21 = &SchemaSymbols::fgELT_ANNOTATION;
          if (psVar17 == (short *)0x0) {
LAB_0033e3c5:
            if (*psVar21 == 0) goto LAB_0033e3cb;
          }
          else {
            do {
              sVar3 = *psVar17;
              if (sVar3 == 0) goto LAB_0033e3c5;
              psVar17 = psVar17 + 1;
              sVar4 = *psVar21;
              psVar21 = psVar21 + 1;
            } while (sVar3 == sVar4);
          }
        }
      }
      if (node == (DOMNode *)0x0) {
LAB_0033e70f:
        node_00 = &redefineChildElem->super_DOMNode;
        iVar10 = 0x7a;
        goto LAB_0033e972;
      }
      node_00 = &XUtil::getFirstChildElement(node)->super_DOMNode;
      if (node_00 == (DOMNode *)0x0) {
        node_00 = (DOMNode *)0x0;
      }
      else {
        iVar12 = (*node_00->_vptr_DOMNode[0x18])(node_00);
        psVar17 = (short *)CONCAT44(extraout_var_03,iVar12);
        if (psVar17 == &SchemaSymbols::fgELT_ANNOTATION) {
LAB_0033e4f8:
          node_00 = &XUtil::getNextSiblingElement(node_00)->super_DOMNode;
        }
        else {
          psVar21 = &SchemaSymbols::fgELT_ANNOTATION;
          if (psVar17 == (short *)0x0) {
LAB_0033e4f2:
            if (*psVar21 == 0) goto LAB_0033e4f8;
          }
          else {
            do {
              sVar3 = *psVar17;
              if (sVar3 == 0) goto LAB_0033e4f2;
              psVar17 = psVar17 + 1;
              sVar4 = *psVar21;
              psVar21 = psVar21 + 1;
            } while (sVar3 == sVar4);
          }
        }
      }
      redefineChildElem = (DOMElement *)node;
      if (node_00 == (DOMNode *)0x0) goto LAB_0033e70f;
      iVar12 = (*node_00->_vptr_DOMNode[0x18])(node_00);
      psVar17 = (short *)CONCAT44(extraout_var_05,iVar12);
      if (psVar17 != &SchemaSymbols::fgELT_RESTRICTION) {
        if (psVar17 == (short *)0x0) {
          psVar21 = &SchemaSymbols::fgELT_RESTRICTION;
LAB_0033e6c7:
          if ((psVar17 != &SchemaSymbols::fgELT_EXTENSION) && (*psVar21 != 0)) goto LAB_0033e6d6;
        }
        else {
          lVar22 = 0;
          do {
            psVar21 = (short *)((long)psVar17 + lVar22);
            if (*psVar21 == 0) {
              psVar21 = (short *)((long)&SchemaSymbols::fgELT_RESTRICTION + lVar22);
              goto LAB_0033e6c7;
            }
            psVar1 = (short *)((long)&SchemaSymbols::fgELT_RESTRICTION + lVar22);
            lVar22 = lVar22 + 2;
          } while (*psVar21 == *psVar1);
          if (psVar17 != &SchemaSymbols::fgELT_EXTENSION) {
LAB_0033e6d6:
            psVar21 = &SchemaSymbols::fgELT_EXTENSION;
            redefineChildElem = (DOMElement *)node_00;
            if (psVar17 == (short *)0x0) {
LAB_0033e6fc:
              if (*psVar21 == 0) goto LAB_0033e719;
            }
            else {
              do {
                sVar3 = *psVar17;
                if (sVar3 == 0) goto LAB_0033e6fc;
                psVar17 = psVar17 + 1;
                sVar4 = *psVar21;
                psVar21 = psVar21 + 1;
              } while (sVar3 == sVar4);
            }
            goto LAB_0033e70f;
          }
        }
      }
LAB_0033e719:
      pXVar18 = getElementAttValue(this,(DOMElement *)node_00,(XMLCh *)SchemaSymbols::fgATT_BASE,
                                   QName);
      iVar12 = XMLString::indexOf(pXVar18,L':');
      if (iVar12 + 1U < 2) {
        pXVar15 = L"";
      }
      else {
        (this->fBuffer).fIndex = 0;
        XMLBuffer::append(this_00,pXVar18,(long)iVar12);
        pXVar5 = this->fStringPool;
        (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
        uVar13 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
        iVar12 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar13);
        pXVar15 = (XMLCh *)CONCAT44(extraout_var_07,iVar12);
      }
      iVar12 = XMLString::indexOf(pXVar18,L':');
      XVar23 = 0;
      if (pXVar18 != (XMLCh *)0x0) {
        do {
          psVar17 = (short *)((long)pXVar18 + XVar23);
          XVar23 = XVar23 + 2;
        } while (*psVar17 != 0);
        XVar23 = ((long)XVar23 >> 1) - 1;
      }
      if (XVar23 == (long)(iVar12 + 1)) {
        puVar24 = &XMLUni::fgZeroLenString;
      }
      else {
        if (iVar12 == -1) {
          this_00->fIndex = 0;
          pXVar20 = pXVar18;
        }
        else {
          XVar23 = XVar23 + ~(long)iVar12;
          this_00->fIndex = 0;
          pXVar20 = pXVar18 + (long)iVar12 + 1;
        }
        XMLBuffer::append(this_00,pXVar20,XVar23);
        pXVar5 = this->fStringPool;
        (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
        uVar13 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
        iVar12 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar13);
        puVar24 = (undefined2 *)CONCAT44(extraout_var_08,iVar12);
      }
      pXVar15 = resolvePrefixToURI(this,(DOMElement *)node_00,pXVar15);
      iVar12 = this->fTargetNSURI;
      iVar14 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                         (this->fURIStringPool,pXVar15);
      if ((iVar12 != iVar14) ||
         (iVar12 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                             (this->fStringPool,puVar24), iVar12 != iVar10)) {
        iVar10 = 0x7b;
        goto LAB_0033e972;
      }
      puVar24 = &SchemaSymbols::fgELT_COMPLEXTYPE;
LAB_0033e913:
      getRedefineNewTypeName(this,pXVar18,redefineNameCounter,this_00);
      (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
      (*node_00->_vptr_DOMNode[0x2c])(node_00,SchemaSymbols::fgATT_BASE);
      RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::put
                (this->fRedefineComponents,puVar24,iVar11,(char16_t *)0x0);
    }
    else {
      pXVar15 = L"complexType";
      pXVar20 = redefineChildComponentName;
      if (redefineChildComponentName == (XMLCh *)0x0) {
LAB_0033e0a5:
        if (*pXVar15 == L'\0') goto LAB_0033e0e1;
      }
      else {
        do {
          XVar25 = *pXVar20;
          if (XVar25 == L'\0') goto LAB_0033e0a5;
          XVar2 = *pXVar15;
          pXVar15 = pXVar15 + 1;
          pXVar20 = pXVar20 + 1;
        } while (XVar25 == XVar2);
      }
      if (redefineChildComponentName == L"group") {
LAB_0033e186:
        pRVar7 = this->fGroupRegistry;
        if ((pXVar18 == (XMLCh *)0x0) || (uVar19 = (ulong)(ushort)*pXVar18, uVar19 == 0)) {
          uVar19 = 0;
        }
        else {
          XVar25 = pXVar18[1];
          if (XVar25 != L'\0') {
            pXVar15 = pXVar18 + 2;
            do {
              uVar19 = (ulong)(ushort)XVar25 + (uVar19 >> 0x18) + uVar19 * 0x26;
              XVar25 = *pXVar15;
              pXVar15 = pXVar15 + 1;
            } while (XVar25 != L'\0');
          }
          uVar19 = uVar19 % pRVar7->fHashModulus;
        }
        pRVar27 = pRVar7->fBucketList[uVar19];
        if (pRVar27 != (RefHashTableBucketElem<xercesc_4_0::XercesGroupInfo> *)0x0) {
          do {
            bVar9 = StringHasher::equals((StringHasher *)&pRVar7->field_0x30,pXVar18,pRVar27->fKey);
            if (bVar9) goto LAB_0033e977;
            pRVar27 = pRVar27->fNext;
          } while (pRVar27 != (RefHashTableBucketElem<xercesc_4_0::XercesGroupInfo> *)0x0);
          if (bVar9) goto LAB_0033e977;
        }
        iVar10 = changeRedefineGroup(this,redefineChildElem,redefineChildComponentName,
                                     redefineChildTypeName,redefineNameCounter);
        if (1 < iVar10) {
          iVar11 = 0x7e;
          goto LAB_0033e88b;
        }
        this_01 = this->fRedefineComponents;
        if (iVar10 == 0) {
          valueToAdopt = this->fSchemaInfo->fCurrentSchemaURL;
          puVar24 = &SchemaSymbols::fgELT_GROUP;
        }
        else {
          puVar24 = &SchemaSymbols::fgELT_GROUP;
LAB_0033e871:
          valueToAdopt = (char16_t *)0x0;
        }
LAB_0033e9a2:
        RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::put
                  (this_01,puVar24,iVar11,valueToAdopt);
      }
      else {
        pXVar15 = L"group";
        pXVar20 = redefineChildComponentName;
        if (redefineChildComponentName == (XMLCh *)0x0) {
LAB_0033e13a:
          if (*pXVar15 == L'\0') goto LAB_0033e186;
        }
        else {
          do {
            XVar25 = *pXVar20;
            if (XVar25 == L'\0') goto LAB_0033e13a;
            XVar2 = *pXVar15;
            pXVar15 = pXVar15 + 1;
            pXVar20 = pXVar20 + 1;
          } while (XVar25 == XVar2);
        }
        if (redefineChildComponentName != L"attributeGroup") {
          pXVar18 = L"attributeGroup";
          pXVar15 = redefineChildComponentName;
          if (redefineChildComponentName != (XMLCh *)0x0) {
            do {
              XVar25 = *pXVar15;
              if (XVar25 == L'\0') goto LAB_0033e2a0;
              XVar2 = *pXVar18;
              pXVar18 = pXVar18 + 1;
              pXVar15 = pXVar15 + 1;
            } while (XVar25 == XVar2);
LAB_0033e2a6:
            reportSchemaError(this,redefineChildElem,L"http://apache.org/xml/messages/XMLErrors",
                              0x80,redefineChildComponentName,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0
                             );
            return false;
          }
LAB_0033e2a0:
          if (*pXVar18 != L'\0') goto LAB_0033e2a6;
        }
        pRVar8 = this->fAttGroupRegistry;
        if ((redefineChildTypeName == (XMLCh *)0x0) ||
           (uVar19 = (ulong)(ushort)*redefineChildTypeName, uVar19 == 0)) {
          uVar19 = 0;
        }
        else {
          XVar25 = redefineChildTypeName[1];
          if (XVar25 != L'\0') {
            pXVar18 = redefineChildTypeName + 2;
            do {
              uVar19 = (ulong)(ushort)XVar25 + (uVar19 >> 0x18) + uVar19 * 0x26;
              XVar25 = *pXVar18;
              pXVar18 = pXVar18 + 1;
            } while (XVar25 != L'\0');
          }
          uVar19 = uVar19 % pRVar8->fHashModulus;
        }
        pRVar28 = pRVar8->fBucketList[uVar19];
        if (pRVar28 != (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0) {
          do {
            bVar9 = StringHasher::equals
                              ((StringHasher *)&pRVar8->field_0x30,redefineChildTypeName,
                               pRVar28->fKey);
            if (bVar9) goto LAB_0033e977;
            pRVar28 = pRVar28->fNext;
          } while (pRVar28 != (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0);
          if (!bVar9) goto LAB_0033e83b;
          goto LAB_0033e977;
        }
LAB_0033e83b:
        iVar10 = changeRedefineGroup(this,redefineChildElem,redefineChildComponentName,
                                     redefineChildTypeName,redefineNameCounter);
        if (iVar10 < 2) {
          this_01 = this->fRedefineComponents;
          if (iVar10 != 0) {
            puVar24 = &SchemaSymbols::fgELT_ATTRIBUTEGROUP;
            goto LAB_0033e871;
          }
          valueToAdopt = this->fSchemaInfo->fCurrentSchemaURL;
          puVar24 = &SchemaSymbols::fgELT_ATTRIBUTEGROUP;
          goto LAB_0033e9a2;
        }
        iVar11 = 0x7f;
LAB_0033e88b:
        reportSchemaError(this,redefineChildElem,L"http://apache.org/xml/messages/XMLErrors",iVar11)
        ;
      }
      if (1 < iVar10) goto LAB_0033e977;
    }
    bVar9 = true;
  }
  return bVar9;
}

Assistant:

bool TraverseSchema::validateRedefineNameChange(const DOMElement* const redefineChildElem,
                                                const XMLCh* const redefineChildComponentName,
                                                const XMLCh* const redefineChildTypeName,
                                                const int redefineNameCounter,
                                                SchemaInfo* const redefiningSchemaInfo) {

    const XMLCh* baseTypeName = 0;
    unsigned int typeNameId = fStringPool->addOrFind(redefineChildTypeName);

    fBuffer.set(fTargetNSURIString);
    fBuffer.append(chComma);
    fBuffer.append(redefineChildTypeName);

    int   fullTypeNameId = fStringPool->addOrFind(fBuffer.getRawBuffer());
    const XMLCh* typeNameStr = fStringPool->getValueForId(fullTypeNameId);

    restoreSchemaInfo(redefiningSchemaInfo);

    if (XMLString::equals(redefineChildComponentName,SchemaSymbols::fgELT_SIMPLETYPE)) {

        if (fDatatypeRegistry->getDatatypeValidator(typeNameStr)) {
            return false;
        }

        DOMElement* grandKid = XUtil::getFirstChildElement(redefineChildElem);

        if (grandKid && XMLString::equals(grandKid->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {
            grandKid = XUtil::getNextSiblingElement(grandKid);
        }

        if (grandKid == 0) {

            reportSchemaError(redefineChildElem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidSimpleType);
            return false;
        }
        else if(!XMLString::equals(grandKid->getLocalName(), SchemaSymbols::fgELT_RESTRICTION)) {

            reportSchemaError(grandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidSimpleType);
            return false;
        }

        baseTypeName = getElementAttValue(grandKid, SchemaSymbols::fgATT_BASE, DatatypeValidator::QName);
        const XMLCh* prefix = getPrefix(baseTypeName);
        const XMLCh* localPart = getLocalPart(baseTypeName);
        const XMLCh* uriStr = resolvePrefixToURI(grandKid, prefix);

        if (fTargetNSURI != (int) fURIStringPool->addOrFind(uriStr)
            || fStringPool->addOrFind(localPart) != typeNameId) {
            reportSchemaError(grandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidSimpleTypeBase);
            return false;
        }

        // now we have to do the renaming...
        getRedefineNewTypeName(baseTypeName, redefineNameCounter, fBuffer);
        grandKid->setAttribute(SchemaSymbols::fgATT_BASE, fBuffer.getRawBuffer());
        fRedefineComponents->put((void*) SchemaSymbols::fgELT_SIMPLETYPE,
                                 fullTypeNameId, 0);
    }
    else if (XMLString::equals(redefineChildComponentName,SchemaSymbols::fgELT_COMPLEXTYPE)) {

        if (fComplexTypeRegistry->containsKey(typeNameStr)) {
            return false;
        }

        DOMElement* grandKid = XUtil::getFirstChildElement(redefineChildElem);

        if (grandKid && XMLString::equals(grandKid->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {
            grandKid = XUtil::getNextSiblingElement(grandKid);
        }

        if (grandKid == 0) {
            reportSchemaError(redefineChildElem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidComplexType);
            return false;
        } else {

            // have to go one more level down; let another pass worry whether complexType is valid.
            DOMElement* greatGrandKid = XUtil::getFirstChildElement(grandKid);

            if (greatGrandKid != 0 &&
                XMLString::equals(greatGrandKid->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {
                greatGrandKid = XUtil::getNextSiblingElement(greatGrandKid);
            }

            if (greatGrandKid == 0) {

                reportSchemaError(grandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidComplexType);
                return false;
            } else {

                const XMLCh* greatGrandKidName = greatGrandKid->getLocalName();

                if (!XMLString::equals(greatGrandKidName, SchemaSymbols::fgELT_RESTRICTION)
                    && !XMLString::equals(greatGrandKidName, SchemaSymbols::fgELT_EXTENSION)) {

                    reportSchemaError(greatGrandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidComplexType);
                    return false;
                }

                baseTypeName = getElementAttValue(greatGrandKid, SchemaSymbols::fgATT_BASE, DatatypeValidator::QName);
                const XMLCh* prefix = getPrefix(baseTypeName);
                const XMLCh* localPart = getLocalPart(baseTypeName);
                const XMLCh* uriStr = resolvePrefixToURI(greatGrandKid, prefix);

                if (fTargetNSURI != (int) fURIStringPool->addOrFind(uriStr)
                    || fStringPool->addOrFind(localPart) != typeNameId) {
                    reportSchemaError(greatGrandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidComplexTypeBase);
                    return false;
                }

                // now we have to do the renaming...
                getRedefineNewTypeName(baseTypeName, redefineNameCounter, fBuffer);
                greatGrandKid->setAttribute(SchemaSymbols::fgATT_BASE, fBuffer.getRawBuffer());
                fRedefineComponents->put((void*) SchemaSymbols::fgELT_COMPLEXTYPE,
                                         fullTypeNameId, 0);
            }
        }
    }
    else if (XMLString::equals(redefineChildComponentName, SchemaSymbols::fgELT_GROUP)) {

        if (fGroupRegistry->containsKey(typeNameStr)) {
            return false;
        }

        int groupRefCount = changeRedefineGroup(redefineChildElem, redefineChildComponentName,
                                                redefineChildTypeName, redefineNameCounter);

        if (groupRefCount > 1) {

            reportSchemaError(redefineChildElem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_GroupRefCount);
            return false;
        }
        else if (groupRefCount == 0) {
            // put a dummy value, default is null.
            // when processing groups, we will check that table, if a value
            // is found, we need to do a particle derivation check.
            fRedefineComponents->put((void*) SchemaSymbols::fgELT_GROUP,
                                     fullTypeNameId, fSchemaInfo->getCurrentSchemaURL());
        }
        else {
            fRedefineComponents->put((void*) SchemaSymbols::fgELT_GROUP, fullTypeNameId, 0);
        }
    }
    else if (XMLString::equals(redefineChildComponentName, SchemaSymbols::fgELT_ATTRIBUTEGROUP)) {

        if (fAttGroupRegistry->containsKey(redefineChildTypeName)) {
            return false;
        }

        int attGroupRefCount = changeRedefineGroup(redefineChildElem, redefineChildComponentName,
                                                   redefineChildTypeName, redefineNameCounter);

        if (attGroupRefCount > 1) {

            reportSchemaError(redefineChildElem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_AttGroupRefCount);
            return false;
        }
        else if (attGroupRefCount == 0) {
            // put a dummy value, default is null.
            // when processing attributeGroups, we will check that table, if
            // a value is found, we need to check for attribute derivation ok
            // (by restriction)
            fRedefineComponents->put((void*) SchemaSymbols::fgELT_ATTRIBUTEGROUP,
                                     fullTypeNameId, fSchemaInfo->getCurrentSchemaURL());
        }
        else {
            fRedefineComponents->put((void*) SchemaSymbols::fgELT_ATTRIBUTEGROUP, fullTypeNameId, 0);
        }
    }
    else {
        reportSchemaError
        (
            redefineChildElem
            , XMLUni::fgXMLErrDomain
            , XMLErrs::Redefine_InvalidChild
            , redefineChildComponentName
        );
        return false;
    }

    return true;
}